

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_dr_wav__metadata_alloc
                    (ma_dr_wav__metadata_parser *pParser,
                    ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_uint8 *pResult;
  ma_dr_wav_metadata *pmVar1;
  
  if ((pParser->extraCapacity != 0) || (pParser->metadataCount != 0)) {
    (*pAllocationCallbacks->onFree)(pParser->pData,pAllocationCallbacks->pUserData);
    pmVar1 = (ma_dr_wav_metadata *)
             (*pAllocationCallbacks->onMalloc)
                       ((ulong)pParser->metadataCount * 0x70 + pParser->extraCapacity,
                        pAllocationCallbacks->pUserData);
    pParser->pData = (ma_uint8 *)pmVar1;
    pParser->pDataCursor = (ma_uint8 *)pmVar1;
    if (pmVar1 == (ma_dr_wav_metadata *)0x0) {
      return MA_OUT_OF_MEMORY;
    }
    pParser->pDataCursor = (ma_uint8 *)(pmVar1 + pParser->metadataCount);
    pParser->pMetadata = pmVar1;
    pParser->metadataCursor = 0;
  }
  return MA_SUCCESS;
}

Assistant:

MA_PRIVATE ma_result ma_dr_wav__metadata_alloc(ma_dr_wav__metadata_parser* pParser, ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pParser->extraCapacity != 0 || pParser->metadataCount != 0) {
        pAllocationCallbacks->onFree(pParser->pData, pAllocationCallbacks->pUserData);
        pParser->pData = (ma_uint8*)pAllocationCallbacks->onMalloc(ma_dr_wav__metadata_memory_capacity(pParser), pAllocationCallbacks->pUserData);
        pParser->pDataCursor = pParser->pData;
        if (pParser->pData == NULL) {
            return MA_OUT_OF_MEMORY;
        }
        pParser->pMetadata = (ma_dr_wav_metadata*)ma_dr_wav__metadata_get_memory(pParser, sizeof(ma_dr_wav_metadata) * pParser->metadataCount, 1);
        pParser->metadataCursor = 0;
    }
    return MA_SUCCESS;
}